

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

QSize __thiscall QTabBar::minimumTabSizeHint(QTabBar *this,int index)

{
  byte *pbVar1;
  long lVar2;
  QString *this_00;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QSize QVar6;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView>
  *__return_storage_ptr__;
  long in_FS_OFFSET;
  QString local_a8;
  QArrayData *local_90;
  char16_t *local_88;
  ulong local_80;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> local_78;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> local_48;
  
  local_48.b.m_data = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = *(QString **)(*(long *)(lVar2 + 0x2e0) + (long)index * 8);
  local_90 = &((this_00->d).d)->super_QArrayData;
  local_88 = (this_00->d).ptr;
  local_80 = (this_00->d).size;
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_80 < 4) {
    local_a8.d.d = (Data *)local_90;
    local_a8.d.ptr = local_88;
    local_a8.d.size = local_80;
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto switchD_0048c872_default;
  }
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  switch(*(undefined4 *)(lVar2 + 0x2ac)) {
  case 0:
    local_48.a.b = (QLatin1String *)(local_88 + (local_80 - 2));
    local_48.a.a.m_size = (qsizetype)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_48.a.a.m_data = (char16_t *)0x2;
    __return_storage_ptr__ = &local_78;
    QStringBuilder<const_QLatin1String_&,_QStringView>::convertTo<QString>
              ((QString *)__return_storage_ptr__,
               (QStringBuilder<const_QLatin1String_&,_QStringView> *)&local_48);
    break;
  case 1:
    local_48.a.a.m_size = 2;
    local_48.a.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    __return_storage_ptr__ = &local_78;
    local_48.a.a.m_data = local_88;
    QStringBuilder<QStringView,_const_QLatin1String_&>::convertTo<QString>
              ((QString *)__return_storage_ptr__,&local_48.a);
    break;
  case 2:
    local_78.b.m_data = local_88 + (local_80 - 1);
    local_78.a.a.m_size = 1;
    local_78.a.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_78.b.m_size = 1;
    __return_storage_ptr__ = &local_48;
    local_78.a.a.m_data = local_88;
    QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView>::
    convertTo<QString>((QString *)__return_storage_ptr__,&local_78);
    break;
  case 3:
    QString::operator=(&local_a8,(QString *)&local_90);
  default:
    goto switchD_0048c872_default;
  }
  local_a8.d.d = ((DataPointer *)&__return_storage_ptr__->a)->d;
  local_a8.d.ptr = ((DataPointer *)&__return_storage_ptr__->a)->ptr;
  local_a8.d.size = ((DataPointer *)&__return_storage_ptr__->a)->size;
switchD_0048c872_default:
  pQVar3 = &((this_00->d).d)->super_QArrayData;
  (this_00->d).d = local_a8.d.d;
  pcVar4 = (this_00->d).ptr;
  (this_00->d).ptr = local_a8.d.ptr;
  qVar5 = (this_00->d).size;
  (this_00->d).size = local_a8.d.size;
  local_a8.d.d = (Data *)pQVar3;
  local_a8.d.ptr = pcVar4;
  local_a8.d.size = qVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 | 4;
  QVar6 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,index);
  QString::operator=(this_00,(QString *)&local_90);
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 & 0xfb;
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,0x10);
    }
  }
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) != local_48.b.m_data) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

QSize QTabBar::minimumTabSizeHint(int index) const
{
    Q_D(const QTabBar);
    QTabBarPrivate::Tab *tab = d->tabList.at(index);
    QString oldText = tab->text;
    tab->text = computeElidedText(d->elideMode, oldText);
    tab->measuringMinimum = true;
    QSize size = tabSizeHint(index);
    tab->text = oldText;
    tab->measuringMinimum = false;
    return size;
}